

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O1

void __thiscall
pg::RTLSolver::attractTangles(RTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G,int maxpr)

{
  int *piVar1;
  int *piVar2;
  
  piVar1 = this->tin[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = this->tin[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    attractTangle(this,*piVar2,pl,R,Z,G,maxpr);
  }
  return;
}

Assistant:

void
RTLSolver::attractTangles(int pl, int v, bitset &R, bitset &Z, bitset &G, int maxpr)
{
    const auto &in_cur = tin[v];
    for (int from : in_cur) attractTangle(from, pl, R, Z, G, maxpr);
}